

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kiste2cpp.cpp
# Opt level: O1

class_t * kiste::parse_class(class_t *__return_storage_ptr__,parse_context *ctx,string *line)

{
  ulong uVar1;
  long lVar2;
  parse_error *this;
  string local_60;
  string local_40;
  
  if (ctx->_class_curly_level == 0) {
    uVar1 = std::__cxx11::string::find_first_not_of((char *)line,0x1090d6,5);
    if (uVar1 != 0xffffffffffffffff) {
      lVar2 = std::__cxx11::string::find_first_of((char *)line,0x1090d6,uVar1);
      (__return_storage_ptr__->_name)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->_name).field_2;
      (__return_storage_ptr__->_name)._M_string_length = 0;
      (__return_storage_ptr__->_name).field_2._M_local_buf[0] = '\0';
      (__return_storage_ptr__->_parent_name)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->_parent_name).field_2;
      (__return_storage_ptr__->_parent_name)._M_string_length = 0;
      (__return_storage_ptr__->_parent_name).field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::substr((ulong)&local_60,(ulong)line);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      if (lVar2 != -1) {
        std::__cxx11::string::substr((ulong)&local_40,(ulong)line);
        parse_parent_class(&local_60,&local_40);
        std::__cxx11::string::operator=
                  ((string *)&__return_storage_ptr__->_parent_name,(string *)&local_60);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_40._M_dataplus._M_p != &local_40.field_2) {
          operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
        }
      }
      return __return_storage_ptr__;
    }
    this = (parse_error *)__cxa_allocate_exception(0x10);
    parse_error::parse_error(this,"Could not find class name");
  }
  else {
    this = (parse_error *)__cxa_allocate_exception(0x10);
    parse_error::parse_error(this,"Cannot open new class here, did you forget to call $endclass?");
  }
  __cxa_throw(this,&parse_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

auto parse_class(const parse_context& ctx, const std::string& line) -> class_t
  {
    if (ctx._class_curly_level)
      throw parse_error("Cannot open new class here, did you forget to call $endclass?");
    const auto nameBegin = line.find_first_not_of(" \t", std::strlen("class"));
    if (nameBegin == line.npos)
      throw parse_error("Could not find class name");
    const auto nameEnd = line.find_first_of(" \t", nameBegin);

    auto cd = class_t{};
    cd._name = (nameEnd == line.npos) ? line.substr(nameBegin)
                                      : line.substr(nameBegin, nameEnd - nameBegin);
    if (nameEnd != line.npos)
    {
      cd._parent_name = parse_parent_class(line.substr(nameEnd));
    };

    return cd;
  }